

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O3

void bits_bitmap2items(char *bitmap,lysc_type_bits *type,lysc_type_bitenum_item **items)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  lysc_type_bitenum_item *plVar5;
  lysc_type_bitenum_item *plVar6;
  int iVar7;
  byte bVar8;
  lysc_type_bitenum_item *plVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  sVar2 = lyplg_type_bits_bitmap_size(type);
  if (sVar2 != 0) {
    plVar6 = type->bits;
    sVar3 = 0;
    iVar4 = 0;
    do {
      iVar7 = iVar4 + 8;
      bVar8 = 1;
      do {
        if ((bitmap[sVar3] & bVar8) != 0) {
          uVar11 = 0;
          plVar9 = plVar6;
          while( true ) {
            if (plVar6 == (lysc_type_bitenum_item *)0x0) {
              uVar12 = 0;
            }
            else {
              uVar12._0_4_ = plVar6[-1].field_4;
              uVar12._4_2_ = plVar6[-1].flags;
              uVar12._6_2_ = *(undefined2 *)&plVar6[-1].field_0x26;
            }
            if ((uVar12 <= uVar11) || ((plVar9->field_4).value == iVar4)) break;
            uVar11 = uVar11 + 1;
            plVar9 = plVar9 + 1;
          }
          if (items == (lysc_type_bitenum_item **)0x0) {
            plVar6 = (lysc_type_bitenum_item *)0x0;
            plVar5 = _DAT_fffffffffffffff8;
          }
          else {
            plVar6 = items[-1];
            plVar5 = plVar6;
          }
          items[(long)plVar6] = plVar9;
          items[-1] = (lysc_type_bitenum_item *)((long)&plVar5->name + 1);
          plVar6 = type->bits;
        }
        if (plVar6 == (lysc_type_bitenum_item *)0x0) {
          lVar10 = -1;
        }
        else {
          lVar10 = *(long *)&plVar6[-1].field_4 + -1;
        }
        iVar1 = iVar4;
        if (iVar4 == plVar6[lVar10].field_4.value) break;
        iVar4 = iVar4 + 1;
        bVar8 = bVar8 * '\x02';
        iVar1 = iVar7;
      } while (iVar4 != iVar7);
      iVar4 = iVar1;
      sVar3 = sVar3 + 1;
    } while (sVar3 != sVar2);
  }
  return;
}

Assistant:

static void
bits_bitmap2items(const char *bitmap, struct lysc_type_bits *type, struct lysc_type_bitenum_item **items)
{
    size_t i, bitmap_size = lyplg_type_bits_bitmap_size(type);
    uint32_t bit_pos;
    uint8_t bitmask;
    const uint8_t *byte;

    bit_pos = 0;
    for (i = 0; i < bitmap_size; ++i) {
        /* check this byte (but not necessarily all bits in the last byte) */
        byte = (uint8_t *)BITS_BITMAP_BYTE(bitmap, bitmap_size, i);
        for (bitmask = 1; bitmask; bitmask <<= 1) {
            if (*byte & bitmask) {
                /* add this bit */
                bits_add_item(bit_pos, type, items);
            }

            if (bit_pos == BITS_LAST_BIT_POSITION(type)) {
                /* we have checked the last valid bit */
                break;
            }

            ++bit_pos;
        }
    }
}